

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.hxx
# Opt level: O1

void __thiscall nuraft::raft_server::commit_ret_elem::commit_ret_elem(commit_ret_elem *this)

{
  (this->awaiter_).status._M_i = idle;
  (this->awaiter_).cvLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->awaiter_).cvLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->awaiter_).cvLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->awaiter_).cvLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->awaiter_).cvLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->awaiter_).cv);
  (this->timer_).t_created_.__d.__r = 0;
  (this->timer_).duration_us_ = 0;
  (this->timer_).first_event_fired_ = true;
  (this->timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->timer_);
  (this->ret_value_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ret_value_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->result_code_ = OK;
  (this->async_result_).
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->async_result_).
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->callback_invoked_ = false;
  return;
}

Assistant:

commit_ret_elem()
        : ret_value_(nullptr)
        , result_code_(cmd_result_code::OK)
        , async_result_(nullptr)
        , callback_invoked_(false)
        {}